

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  int iVar1;
  CURLcode CVar2;
  ushort **ppuVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  long *local_a0;
  bool local_91;
  proxy_info *proxyinfo;
  char *endp;
  char *ptr;
  CURLcode result;
  _Bool sockstype;
  char *proxypasswd;
  char *proxyuser;
  long port;
  char *atsign;
  char *portptr;
  char *proxyptr;
  char *endofprot;
  char *prox_portno;
  char *pcStack_28;
  curl_proxytype proxytype_local;
  char *proxy_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  proxyuser = (char *)0xffffffffffffffff;
  proxypasswd = (char *)0x0;
  _result = (char *)0x0;
  prox_portno._4_4_ = proxytype;
  pcStack_28 = proxy;
  proxy_local = (char *)conn;
  conn_local = (connectdata *)data;
  proxyptr = strstr(proxy,"://");
  if (proxyptr == (char *)0x0) {
    portptr = pcStack_28;
  }
  else {
    portptr = proxyptr + 3;
    iVar1 = curl_strnequal("https",pcStack_28,5);
    if (iVar1 == 0) {
      iVar1 = curl_strnequal("socks5h",pcStack_28,7);
      if (iVar1 == 0) {
        iVar1 = curl_strnequal("socks5",pcStack_28,6);
        if (iVar1 == 0) {
          iVar1 = curl_strnequal("socks4a",pcStack_28,7);
          if (iVar1 == 0) {
            iVar1 = curl_strnequal("socks4",pcStack_28,6);
            if ((iVar1 == 0) && (iVar1 = curl_strnequal("socks",pcStack_28,5), iVar1 == 0)) {
              iVar1 = curl_strnequal("http:",pcStack_28,5);
              if (iVar1 == 0) {
                Curl_failf((Curl_easy *)conn_local,"Unsupported proxy scheme for \'%s\'",pcStack_28)
                ;
                return CURLE_COULDNT_CONNECT;
              }
            }
            else {
              prox_portno._4_4_ = CURLPROXY_SOCKS4;
            }
          }
          else {
            prox_portno._4_4_ = CURLPROXY_SOCKS4A;
          }
        }
        else {
          prox_portno._4_4_ = CURLPROXY_SOCKS5;
        }
      }
      else {
        prox_portno._4_4_ = CURLPROXY_SOCKS5_HOSTNAME;
      }
    }
    else {
      prox_portno._4_4_ = CURLPROXY_HTTPS;
    }
  }
  local_91 = true;
  if (((prox_portno._4_4_ != CURLPROXY_SOCKS5_HOSTNAME) &&
      (local_91 = true, prox_portno._4_4_ != CURLPROXY_SOCKS5)) &&
     (local_91 = true, prox_portno._4_4_ != CURLPROXY_SOCKS4A)) {
    local_91 = prox_portno._4_4_ == CURLPROXY_SOCKS4;
  }
  ptr._7_1_ = local_91;
  port = (long)strchr(portptr,0x40);
  if ((char *)port != (char *)0x0) {
    CVar2 = parse_login_details(portptr,port - (long)portptr,&proxypasswd,(char **)&result,
                                (char **)0x0);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    portptr = (char *)(port + 1);
    ptr._0_4_ = 0;
  }
  atsign = portptr;
  if (*portptr == '[') {
    endp = portptr + 1;
    portptr = endp;
    while( true ) {
      bVar6 = false;
      if (*endp != '\0') {
        ppuVar3 = __ctype_b_loc();
        bVar6 = true;
        if ((((*ppuVar3)[(int)(uint)(byte)*endp] & 0x1000) == 0) && (bVar6 = true, *endp != ':')) {
          bVar6 = *endp == '.';
        }
      }
      if (!bVar6) break;
      endp = endp + 1;
    }
    if (*endp == '%') {
      iVar1 = strncmp("%25",endp,3);
      if (iVar1 != 0) {
        Curl_infof((Curl_easy *)conn_local,"Please URL encode %% as %%25, see RFC 6874.\n");
      }
      do {
        endp = endp + 1;
        bVar6 = false;
        if (*endp != '\0') {
          ppuVar3 = __ctype_b_loc();
          bVar6 = true;
          if (((*ppuVar3)[(int)(uint)(byte)*endp] & 0x400) == 0) {
            ppuVar3 = __ctype_b_loc();
            bVar6 = true;
            if (((((*ppuVar3)[(int)(uint)(byte)*endp] & 0x1000) == 0) &&
                (bVar6 = true, *endp != '-')) &&
               ((bVar6 = true, *endp != '.' && (bVar6 = true, *endp != '_')))) {
              bVar6 = *endp == '~';
            }
          }
        }
      } while (bVar6);
    }
    if (*endp == ']') {
      *endp = '\0';
      endp = endp + 1;
    }
    else {
      Curl_infof((Curl_easy *)conn_local,"Invalid IPv6 address format\n");
    }
    atsign = endp;
  }
  endofprot = strchr(atsign,0x3a);
  if (endofprot == (char *)0x0) {
    if (*portptr == '/') {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    port = (long)strchr(portptr,0x2f);
    if ((char *)port != (char *)0x0) {
      *(char *)port = '\0';
    }
    if (conn_local->local_port == 0) {
      if (prox_portno._4_4_ == CURLPROXY_HTTPS) {
        proxyuser = (char *)0x1bb;
      }
      else {
        proxyuser = (char *)0x438;
      }
    }
    else {
      proxyuser = (char *)conn_local->local_port;
    }
  }
  else {
    proxyinfo = (proxy_info *)0x0;
    *endofprot = '\0';
    endofprot = endofprot + 1;
    proxyuser = (char *)strtol(endofprot,(char **)&proxyinfo,10);
    if (((((proxyinfo == (proxy_info *)0x0) || (*(char *)&(proxyinfo->host).rawalloc == '\0')) ||
         (*(char *)&(proxyinfo->host).rawalloc == '/')) ||
        (*(char *)&(proxyinfo->host).rawalloc == ' ')) &&
       ((-1 < (long)proxyuser && ((long)proxyuser < 0x10000)))) {
      *(char **)(proxy_local + 400) = proxyuser;
    }
    else {
      Curl_infof((Curl_easy *)conn_local,"No valid port number in proxy string (%s)\n",endofprot);
    }
  }
  if (*portptr != '\0') {
    if ((ptr._7_1_ & 1) == 0) {
      local_a0 = (long *)(proxy_local + 0x150);
    }
    else {
      local_a0 = (long *)(proxy_local + 0x110);
    }
    *(curl_proxytype *)(local_a0 + 5) = prox_portno._4_4_;
    if (proxypasswd != (char *)0x0) {
      (*Curl_cfree)((void *)local_a0[6]);
      local_a0[6] = 0;
      pcVar4 = curl_easy_unescape((Curl_easy *)conn_local,proxypasswd,0,(int *)0x0);
      local_a0[6] = (long)pcVar4;
      (*Curl_cfree)(proxypasswd);
      proxypasswd = (char *)0x0;
      if (local_a0[6] == 0) {
        (*Curl_cfree)(_result);
        return CURLE_OUT_OF_MEMORY;
      }
      (*Curl_cfree)((void *)local_a0[7]);
      local_a0[7] = 0;
      if ((_result == (char *)0x0) || (sVar5 = strlen(_result), 0xff < sVar5)) {
        pcVar4 = (*Curl_cstrdup)("");
        local_a0[7] = (long)pcVar4;
      }
      else {
        pcVar4 = curl_easy_unescape((Curl_easy *)conn_local,_result,0,(int *)0x0);
        local_a0[7] = (long)pcVar4;
      }
      (*Curl_cfree)(_result);
      _result = (char *)0x0;
      if (local_a0[7] == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      proxy_local[0x3d9] = '\x01';
    }
    if ((-1 < (long)proxyuser) &&
       (((local_a0[4] = (long)proxyuser, *(long *)(proxy_local + 400) < 0 || ((ptr._7_1_ & 1) != 0))
        || (*(long *)(proxy_local + 0x110) == 0)))) {
      *(char **)(proxy_local + 400) = proxyuser;
    }
    (*Curl_cfree)((void *)*local_a0);
    *local_a0 = 0;
    pcVar4 = (*Curl_cstrdup)(portptr);
    *local_a0 = (long)pcVar4;
    local_a0[2] = *local_a0;
    if (*local_a0 == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (*Curl_cfree)(proxypasswd);
  proxypasswd = (char *)0x0;
  (*Curl_cfree)(_result);
  return CURLE_OK;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *prox_portno;
  char *endofprot;

  /* We use 'proxyptr' to point to the proxy name from now on... */
  char *proxyptr;
  char *portptr;
  char *atsign;
  long port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  bool sockstype;

  /* We do the proxy host string parsing here. We want the host name and the
   * port name. Accept a protocol:// prefix
   */

  /* Parse the protocol part if present */
  endofprot = strstr(proxy, "://");
  if(endofprot) {
    proxyptr = endofprot+3;
    if(checkprefix("https", proxy))
      proxytype = CURLPROXY_HTTPS;
    else if(checkprefix("socks5h", proxy))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(checkprefix("socks5", proxy))
      proxytype = CURLPROXY_SOCKS5;
    else if(checkprefix("socks4a", proxy))
      proxytype = CURLPROXY_SOCKS4A;
    else if(checkprefix("socks4", proxy) || checkprefix("socks", proxy))
      proxytype = CURLPROXY_SOCKS4;
    else if(checkprefix("http:", proxy))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      return CURLE_COULDNT_CONNECT;
    }
  }
  else
    proxyptr = proxy; /* No xxx:// head: It's a HTTP proxy */

#ifndef HTTPS_PROXY_SUPPORT
  if(proxytype == CURLPROXY_HTTPS) {
    failf(data, "Unsupported proxy \'%s\'"
                ", libcurl is built without the HTTPS-proxy support.", proxy);
    return CURLE_NOT_BUILT_IN;
  }
#endif

  sockstype = proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
              proxytype == CURLPROXY_SOCKS5 ||
              proxytype == CURLPROXY_SOCKS4A ||
              proxytype == CURLPROXY_SOCKS4;

  /* Is there a username and password given in this proxy url? */
  atsign = strchr(proxyptr, '@');
  if(atsign) {
    CURLcode result =
      parse_login_details(proxyptr, atsign - proxyptr,
                              &proxyuser, &proxypasswd, NULL);
    if(result)
      return result;
    proxyptr = atsign + 1;
  }

  /* start scanning for port number at this point */
  portptr = proxyptr;

  /* detect and extract RFC6874-style IPv6-addresses */
  if(*proxyptr == '[') {
    char *ptr = ++proxyptr; /* advance beyond the initial bracket */
    while(*ptr && (ISXDIGIT(*ptr) || (*ptr == ':') || (*ptr == '.')))
      ptr++;
    if(*ptr == '%') {
      /* There might be a zone identifier */
      if(strncmp("%25", ptr, 3))
        infof(data, "Please URL encode %% as %%25, see RFC 6874.\n");
      ptr++;
      /* Allow unreserved characters as defined in RFC 3986 */
      while(*ptr && (ISALPHA(*ptr) || ISXDIGIT(*ptr) || (*ptr == '-') ||
                     (*ptr == '.') || (*ptr == '_') || (*ptr == '~')))
        ptr++;
    }
    if(*ptr == ']')
      /* yeps, it ended nicely with a bracket as well */
      *ptr++ = 0;
    else
      infof(data, "Invalid IPv6 address format\n");
    portptr = ptr;
    /* Note that if this didn't end with a bracket, we still advanced the
     * proxyptr first, but I can't see anything wrong with that as no host
     * name nor a numeric can legally start with a bracket.
     */
  }

  /* Get port number off proxy.server.com:1080 */
  prox_portno = strchr(portptr, ':');
  if(prox_portno) {
    char *endp = NULL;

    *prox_portno = 0x0; /* cut off number from host name */
    prox_portno ++;
    /* now set the local port number */
    port = strtol(prox_portno, &endp, 10);
    if((endp && *endp && (*endp != '/') && (*endp != ' ')) ||
       (port < 0) || (port > 65535)) {
      /* meant to detect for example invalid IPv6 numerical addresses without
         brackets: "2a00:fac0:a000::7:13". Accept a trailing slash only
         because we then allow "URL style" with the number followed by a
         slash, used in curl test cases already. Space is also an acceptable
         terminating symbol. */
      infof(data, "No valid port number in proxy string (%s)\n",
            prox_portno);
    }
    else
      conn->port = port;
  }
  else {
    if(proxyptr[0]=='/')
      /* If the first character in the proxy string is a slash, fail
         immediately. The following code will otherwise clear the string which
         will lead to code running as if no proxy was set! */
      return CURLE_COULDNT_RESOLVE_PROXY;

    /* without a port number after the host name, some people seem to use
       a slash so we strip everything from the first slash */
    atsign = strchr(proxyptr, '/');
    if(atsign)
      *atsign = '\0'; /* cut off path part from host name */

    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }

  if(*proxyptr) {
    struct proxy_info *proxyinfo =
      sockstype ? &conn->socks_proxy : &conn->http_proxy;
    proxyinfo->proxytype = proxytype;

    if(proxyuser) {
      /* found user and password, rip them out.  note that we are unescaping
         them, as there is otherwise no way to have a username or password
         with reserved characters like ':' in them. */
      Curl_safefree(proxyinfo->user);
      proxyinfo->user = curl_easy_unescape(data, proxyuser, 0, NULL);
      Curl_safefree(proxyuser);

      if(!proxyinfo->user) {
        Curl_safefree(proxypasswd);
        return CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(proxyinfo->passwd);
      if(proxypasswd && strlen(proxypasswd) < MAX_CURL_PASSWORD_LENGTH)
        proxyinfo->passwd = curl_easy_unescape(data, proxypasswd, 0, NULL);
      else
        proxyinfo->passwd = strdup("");
      Curl_safefree(proxypasswd);

      if(!proxyinfo->passwd)
        return CURLE_OUT_OF_MEMORY;

      conn->bits.proxy_user_passwd = TRUE; /* enable it */
    }

    if(port >= 0) {
      proxyinfo->port = port;
      if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
        conn->port = port;
    }

    /* now, clone the cleaned proxy host name */
    Curl_safefree(proxyinfo->host.rawalloc);
    proxyinfo->host.rawalloc = strdup(proxyptr);
    proxyinfo->host.name = proxyinfo->host.rawalloc;

    if(!proxyinfo->host.rawalloc)
      return CURLE_OUT_OF_MEMORY;
  }

  Curl_safefree(proxyuser);
  Curl_safefree(proxypasswd);

  return CURLE_OK;
}